

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::File>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::asFile
          (InMemoryDirectory *this,Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,
          EntryImpl *entry,WriteMode mode)

{
  bool bVar1;
  Own<const_kj::File> *this_00;
  File *pFVar2;
  SymlinkNode *this_01;
  Impl *pIVar3;
  int __flags;
  undefined4 in_register_0000000c;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar4;
  void *__child_stack;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *extraout_RDX_02;
  WriteMode a;
  void *in_R8;
  Maybe<kj::Own<const_kj::File>_> MVar5;
  PathPtr path;
  Fault local_b8;
  Fault f_1;
  Own<const_kj::File> local_a0;
  undefined1 local_90 [24];
  Fault f;
  undefined1 local_70 [32];
  Path newPath;
  WriteMode mode_local;
  EntryImpl *entry_local;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock_local;
  InMemoryDirectory *this_local;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_0000000c,mode);
  a = (WriteMode)in_R8;
  pEVar4 = ctx;
  bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::is<kj::(anonymous_namespace)::InMemoryDirectory::FileNode>
                    ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      *)(ctx + 0x18));
  __flags = (int)pEVar4;
  if (bVar1) {
    this_00 = &OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
               ::get<kj::(anonymous_namespace)::InMemoryDirectory::FileNode>
                         ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                           *)(ctx + 0x18))->file;
    pFVar2 = Own<const_kj::File>::operator->(this_00);
    File::clone((File *)&newPath.parts.disposer,(__fn *)pFVar2,__child_stack,__flags,in_R8);
    Maybe<kj::Own<const_kj::File>_>::Maybe
              ((Maybe<kj::Own<const_kj::File>_> *)this,
               (Own<const_kj::File> *)&newPath.parts.disposer);
    Own<const_kj::File>::~Own((Own<const_kj::File> *)&newPath.parts.disposer);
    pFVar2 = extraout_RDX;
  }
  else {
    bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::is<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                        *)(ctx + 0x18));
    if (bVar1) {
      this_01 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                ::get<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                          ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                            *)(ctx + 0x18));
      SymlinkNode::parse((Path *)(local_70 + 0x18),this_01);
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry);
      PathPtr::PathPtr((PathPtr *)&f,(Path *)(local_70 + 0x18));
      operator-(a,CREATE_PARENT);
      path.parts.size_ = (size_t)f.exception;
      path.parts.ptr = (String *)lock;
      tryOpenFile(this,path,local_70._0_4_);
      Path::~Path((Path *)(local_70 + 0x18));
      pFVar2 = extraout_RDX_00;
    }
    else {
      bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
              ::operator==((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                            *)(ctx + 0x18),(void *)0x0);
      if (bVar1) {
        bVar1 = has<kj::WriteMode,void>(a,CREATE);
        if (!bVar1) {
          _::Debug::Fault::Fault
                    ((Fault *)(local_90 + 0x10),
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x660,FAILED,"has(mode, WriteMode::CREATE)","");
          _::Debug::Fault::fatal((Fault *)(local_90 + 0x10));
        }
        pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry);
        Impl::modified(pIVar3);
        pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry);
        newInMemoryFile((kj *)&f_1,pIVar3->clock);
        Own<const_kj::File>::Own(&local_a0,(Own<kj::File> *)&f_1);
        EntryImpl::init((EntryImpl *)local_90,ctx);
        Maybe<kj::Own<const_kj::File>_>::Maybe
                  ((Maybe<kj::Own<const_kj::File>_> *)this,(Own<const_kj::File> *)local_90);
        Own<const_kj::File>::~Own((Own<const_kj::File> *)local_90);
        FileNode::~FileNode((FileNode *)&local_a0);
        Own<kj::File>::~Own((Own<kj::File> *)&f_1);
        pFVar2 = extraout_RDX_01;
      }
      else {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                  (&local_b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x664,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
        Maybe<kj::Own<const_kj::File>_>::Maybe((Maybe<kj::Own<const_kj::File>_> *)this,(void *)0x0);
        _::Debug::Fault::~Fault(&local_b8);
        pFVar2 = extraout_RDX_02;
      }
    }
  }
  MVar5.ptr.ptr = pFVar2;
  MVar5.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File>_>)MVar5.ptr;
}

Assistant:

Maybe<Own<const File>> asFile(kj::Locked<Impl>& lock, EntryImpl& entry, WriteMode mode) const {
    if (entry.node.is<FileNode>()) {
      return entry.node.get<FileNode>().file->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      // CREATE_PARENT doesn't apply to creating the parents of a symlink target. However, the
      // target itself can still be created.
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenFile(newPath, mode - WriteMode::CREATE_PARENT);
    } else if (entry.node == nullptr) {
      KJ_ASSERT(has(mode, WriteMode::CREATE));
      lock->modified();
      return entry.init(FileNode { newInMemoryFile(lock->clock) });
    } else {
      KJ_FAIL_REQUIRE("not a file") { return nullptr; }
    }
  }